

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

vm_obj_id_t CVmObjFileName::create_from_sfid(int32_t sfid,char *str,size_t len)

{
  vm_obj_id_t vVar1;
  undefined8 in_RDX;
  CVmObjFileName *in_RSI;
  vm_obj_id_t id;
  undefined4 in_stack_ffffffffffffffd8;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int32_t sfid_00;
  
  sfid_00 = (int32_t)((ulong)in_RDX >> 0x20);
  vVar1 = vm_new_id(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  CVmObject::operator_new(CONCAT44(vVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  CVmObjFileName(in_RSI,sfid_00,(char *)CONCAT44(vVar1,in_stack_ffffffffffffffe0),
                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_sfid(VMG_ int32_t sfid,
                                             const char *str, size_t len)
{
    /* allocate the new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create the object */
    new (vmg_ id) CVmObjFileName(vmg_ sfid, str, len);

    /* return the new ID */
    return id;
}